

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

Instruction * __thiscall spvtools::opt::Instruction::GetBaseAddress(Instruction *this)

{
  bool bVar1;
  uint32_t uVar2;
  Op OVar3;
  IRContext *pIVar4;
  DefUseManager *pDVar5;
  Instruction *pIStack_20;
  bool done;
  Instruction *base_inst;
  uint32_t base;
  Instruction *this_local;
  
  uVar2 = GetSingleWordInOperand(this,0);
  pIVar4 = context(this);
  pDVar5 = IRContext::get_def_use_mgr(pIVar4);
  pIStack_20 = analysis::DefUseManager::GetDef(pDVar5,uVar2);
  bVar1 = false;
  while (!bVar1) {
    OVar3 = opcode(pIStack_20);
    if ((((OVar3 == OpImageTexelPointer) || (OVar3 - OpAccessChain < 3)) ||
        (OVar3 == OpInBoundsPtrAccessChain)) || (OVar3 == OpCopyObject)) {
      uVar2 = GetSingleWordInOperand(pIStack_20,0);
      pIVar4 = context(this);
      pDVar5 = IRContext::get_def_use_mgr(pIVar4);
      pIStack_20 = analysis::DefUseManager::GetDef(pDVar5,uVar2);
    }
    else {
      bVar1 = true;
    }
  }
  return pIStack_20;
}

Assistant:

Instruction* Instruction::GetBaseAddress() const {
  uint32_t base = GetSingleWordInOperand(kLoadBaseIndex);
  Instruction* base_inst = context()->get_def_use_mgr()->GetDef(base);
  bool done = false;
  while (!done) {
    switch (base_inst->opcode()) {
      case spv::Op::OpAccessChain:
      case spv::Op::OpInBoundsAccessChain:
      case spv::Op::OpPtrAccessChain:
      case spv::Op::OpInBoundsPtrAccessChain:
      case spv::Op::OpImageTexelPointer:
      case spv::Op::OpCopyObject:
        // All of these instructions have the base pointer use a base pointer
        // in in-operand 0.
        base = base_inst->GetSingleWordInOperand(0);
        base_inst = context()->get_def_use_mgr()->GetDef(base);
        break;
      default:
        done = true;
        break;
    }
  }
  return base_inst;
}